

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O1

uint128 * __thiscall trng::portable_impl::uint128::operator%=(uint128 *this,uint128 other)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  bool bVar6;
  
  uVar2 = other.m_hi;
  uVar3 = other.m_lo;
  uVar5 = 0x80;
  uVar1 = 0;
  uVar4 = 0;
  do {
    uVar1 = uVar1 << 1 | uVar4 >> 0x3f;
    uVar4 = (ulong)((this->m_hi >> ((ulong)((int)uVar5 - 1U & 0xff) & 0x3f) & 1) != 0) + uVar4 * 2;
    if ((uVar2 < uVar1) || ((uVar1 == uVar2 && (uVar3 <= uVar4)))) {
      bVar6 = uVar4 < uVar3;
      uVar4 = uVar4 - uVar3;
      uVar1 = (uVar1 - uVar2) - (ulong)bVar6;
    }
    uVar5 = uVar5 - 1;
  } while (0x40 < uVar5);
  uVar5 = 0x3f;
  do {
    uVar1 = uVar1 << 1 | uVar4 >> 0x3f;
    uVar4 = (ulong)((this->m_lo >> (uVar5 & 0x3f) & 1) != 0) + uVar4 * 2;
    if ((uVar2 < uVar1) || ((uVar1 == uVar2 && (uVar3 <= uVar4)))) {
      bVar6 = uVar4 < uVar3;
      uVar4 = uVar4 - uVar3;
      uVar1 = (uVar1 - uVar2) - (ulong)bVar6;
    }
    bVar6 = uVar5 != 0;
    uVar5 = uVar5 - 1;
  } while (bVar6);
  this->m_lo = uVar4;
  this->m_hi = uVar1;
  return this;
}

Assistant:

uint128 &operator%=(uint128 other) {
        uint128 q;
        uint128 r;
        for (int i{127}; i >= 64; --i) {
          r <<= 1;
          r.m_lo |= (this->m_hi & (1ull << (i - 64))) > 0 ? 1 : 0;
          if (r >= other) {
            r -= other;
            q.m_hi |= 1ull << (i - 64);
          }
        }
        for (int i{63}; i >= 0; --i) {
          r <<= 1;
          r.m_lo |= (this->m_lo & (1ull << i)) > 0 ? 1 : 0;
          if (r >= other) {
            r -= other;
            q.m_lo |= 1ull << i;
          }
        }
        this->m_lo = r.m_lo;
        this->m_hi = r.m_hi;
        return *this;
      }